

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabelDelta
          (BaseBuilder *this,Label *label,Label *base,size_t dataSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Error EVar3;
  ulong uVar4;
  BaseNode *unaff_R15;
  size_t local_30;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    return 5;
  }
  if ((dataSize != 0) &&
     ((8 < dataSize ||
      (uVar4 = dataSize - (dataSize >> 1 & 0x5555555555555555),
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
      1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,2,(char *)0x0);
    return EVar3;
  }
  if (*(long *)&this->_allocator == 0) {
    embedLabelDelta();
  }
  else {
    uVar1 = (label->super_Operand).super_Operand_._baseId;
    uVar2 = (base->super_Operand).super_Operand_._baseId;
    unaff_R15 = (BaseNode *)ZoneAllocator::_alloc(&this->_allocator,0x40,&local_30);
    if (unaff_R15 != (BaseNode *)0x0) {
      *(undefined8 *)unaff_R15 = 0;
      *(undefined8 *)(unaff_R15 + 8) = 0;
      unaff_R15[0x10] = (BaseNode)0x7;
      unaff_R15[0x11] = (BaseNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(unaff_R15 + 0x12) = 0;
      *(undefined8 *)(unaff_R15 + 0x1a) = 0;
      *(undefined8 *)(unaff_R15 + 0x20) = 0;
      *(undefined8 *)(unaff_R15 + 0x28) = 0;
      *(uint32_t *)(unaff_R15 + 0x30) = uVar1;
      *(uint32_t *)(unaff_R15 + 0x34) = uVar2;
      *(int *)(unaff_R15 + 0x38) = (int)dataSize;
      goto LAB_001177b4;
    }
  }
  EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  if (EVar3 != 0) {
    return EVar3;
  }
LAB_001177b4:
  addNode(this,unaff_R15);
  return 0;
}

Assistant:

Error BaseBuilder::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelDeltaNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelDeltaNode>(&node, label.id(), base.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}